

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

bool sensors_analytics::utils::CheckUtf8Valid(string *str)

{
  int iVar1;
  uchar *puVar2;
  long lVar3;
  uchar *begin;
  uchar *bytes;
  string *str_local;
  
  puVar2 = (uchar *)std::__cxx11::string::data();
  begin = puVar2;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          iVar1 = std::__cxx11::string::length();
          if ((long)iVar1 <= (long)begin - (long)puVar2) {
            lVar3 = std::__cxx11::string::length();
            return (long)begin - (long)puVar2 == lVar3;
          }
          if ((((*begin != '\t') && (*begin != '\n')) && (*begin != '\r')) &&
             ((*begin < 0x20 || (0x7e < *begin)))) break;
          begin = begin + 1;
        }
        if (((*begin < 0xc2) || (0xdf < *begin)) || ((begin[1] < 0x80 || (0xbf < begin[1])))) break;
        begin = begin + 2;
      }
      if ((((((*begin != 0xe0) || (begin[1] < 0xa0)) || (0xbf < begin[1])) ||
           ((begin[2] < 0x80 || (0xbf < begin[2])))) &&
          ((((*begin < 0xe1 || (0xec < *begin)) && ((*begin != 0xee && (*begin != 0xef)))) ||
           ((begin[1] < 0x80 || (((0xbf < begin[1] || (begin[2] < 0x80)) || (0xbf < begin[2]))))))))
         && ((((*begin != 0xed || (begin[1] < 0x80)) || (0x9f < begin[1])) ||
             ((begin[2] < 0x80 || (0xbf < begin[2])))))) break;
      begin = begin + 3;
    }
    if (((((((*begin != 0xf0) || (begin[1] < 0x90)) || (0xbf < begin[1])) ||
          ((begin[2] < 0x80 || (0xbf < begin[2])))) || (begin[3] < 0x80)) || (0xbf < begin[3])) &&
       ((((*begin < 0xf1 || (0xf3 < *begin)) ||
         (((begin[1] < 0x80 || (((0xbf < begin[1] || (begin[2] < 0x80)) || (0xbf < begin[2])))) ||
          ((begin[3] < 0x80 || (0xbf < begin[3])))))) &&
        ((*begin != 0xf4 ||
         (((begin[1] < 0x80 || (0x8f < begin[1])) ||
          ((begin[2] < 0x80 || (((0xbf < begin[2] || (begin[3] < 0x80)) || (0xbf < begin[3])))))))))
        ))) break;
    begin = begin + 4;
  }
  return false;
}

Assistant:

bool CheckUtf8Valid(const string &str) {
  // https://stackoverflow.com/a/1031773
  const unsigned char *bytes = (const unsigned char *) str.data();
  const unsigned char *begin = bytes;
  while (bytes - begin < (int)str.length()) {
    if ((bytes[0] == 0x09 || bytes[0] == 0x0A || bytes[0] == 0x0D ||
        (0x20 <= bytes[0] && bytes[0] <= 0x7E))) {
      bytes += 1;
      continue;
    }
    if (((0xC2 <= bytes[0] && bytes[0] <= 0xDF)
        && (0x80 <= bytes[1] && bytes[1] <= 0xBF))) {
      bytes += 2;
      continue;
    }
    if ((bytes[0] == 0xE0 && (0xA0 <= bytes[1] && bytes[1] <= 0xBF) &&
        (0x80 <= bytes[2] && bytes[2] <= 0xBF)) ||
        (((0xE1 <= bytes[0] && bytes[0] <= 0xEC) || bytes[0] == 0xEE
            || bytes[0] == 0xEF) &&
            (0x80 <= bytes[1] && bytes[1] <= 0xBF)
            && (0x80 <= bytes[2] && bytes[2] <= 0xBF)) ||
        (bytes[0] == 0xED && (0x80 <= bytes[1] && bytes[1] <= 0x9F) &&
            (0x80 <= bytes[2] && bytes[2] <= 0xBF))) {
      bytes += 3;
      continue;
    }
    if ((bytes[0] == 0xF0 && (0x90 <= bytes[1] && bytes[1] <= 0xBF) &&
        (0x80 <= bytes[2] && bytes[2] <= 0xBF) &&
        (0x80 <= bytes[3] && bytes[3] <= 0xBF)) ||
        ((0xF1 <= bytes[0] && bytes[0] <= 0xF3)
            && (0x80 <= bytes[1] && bytes[1] <= 0xBF) &&
            (0x80 <= bytes[2] && bytes[2] <= 0xBF)
            && (0x80 <= bytes[3] && bytes[3] <= 0xBF)) ||
        (bytes[0] == 0xF4 && (0x80 <= bytes[1] && bytes[1] <= 0x8F) &&
            (0x80 <= bytes[2] && bytes[2] <= 0xBF) &&
            (0x80 <= bytes[3] && bytes[3] <= 0xBF))) {
      bytes += 4;
      continue;
    }
    return false;
  }
  return bytes - begin == str.length();
}